

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

Own<kj::_::Event> * __thiscall
kj::Own<kj::_::Event>::operator=(Own<kj::_::Event> *this,Own<kj::_::Event> *other)

{
  Event *object;
  Event *this_00;
  Event *pEVar1;
  Disposer *in_RDX;
  
  object = (Event *)this->disposer;
  this_00 = this->ptr;
  pEVar1 = other->ptr;
  this->disposer = other->disposer;
  this->ptr = pEVar1;
  other->ptr = (Event *)0x0;
  if (this_00 != (Event *)0x0) {
    Disposer::Dispose_<kj::_::Event,_true>::dispose
              ((Dispose_<kj::_::Event,_true> *)this_00,object,in_RDX);
  }
  return this;
}

Assistant:

inline Own& operator=(Own&& other) {
    // Move-assingnment operator.

    // Careful, this might own `other`.  Therefore we have to transfer the pointers first, then
    // dispose.
    const Disposer* disposerCopy = disposer;
    T* ptrCopy = ptr;
    disposer = other.disposer;
    ptr = other.ptr;
    other.ptr = nullptr;
    if (ptrCopy != nullptr) {
      disposerCopy->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
    return *this;
  }